

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uic.cpp
# Opt level: O2

bool __thiscall Uic::printDependencies(Uic *this)

{
  Option *pOVar1;
  long lVar2;
  DomIncludes *pDVar3;
  DomInclude **ppDVar4;
  long *plVar5;
  DomCustomWidgets *pDVar6;
  DomCustomWidget **ppDVar7;
  FILE *pFVar8;
  char cVar9;
  DomUI *this_00;
  char *pcVar10;
  bool bVar11;
  long lVar12;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_b0;
  QArrayDataPointer<char16_t> local_98;
  QXmlStreamReader reader;
  QString local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pOVar1 = this->opt;
  local_50.d = (pOVar1->inputFile).d.d;
  local_50.ptr = (pOVar1->inputFile).d.ptr;
  lVar2 = (pOVar1->inputFile).d.size;
  if (local_50.d != (Data *)0x0) {
    LOCK();
    ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_68.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_68.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_50.size = lVar2;
  QFile::QFile((QFile *)&local_68);
  if (lVar2 == 0) {
    bVar11 = false;
    cVar9 = QFile::open(&local_68,_stdin,1,0);
    if (cVar9 == '\0') goto LAB_0016d3b3;
LAB_0016d142:
    _reader = (Data *)0xaaaaaaaaaaaaaaaa;
    QXmlStreamReader::QXmlStreamReader(&reader);
    QXmlStreamReader::setDevice((QIODevice *)&reader);
    this_00 = parseUiFile(&reader);
    QXmlStreamReader::~QXmlStreamReader(&reader);
    if (this_00 != (DomUI *)0x0) {
      pDVar3 = this_00->m_includes;
      if (pDVar3 != (DomIncludes *)0x0) {
        _reader = (pDVar3->m_include).d.d;
        ppDVar4 = (pDVar3->m_include).d.ptr;
        lVar2 = (pDVar3->m_include).d.size;
        if (_reader != (Data *)0x0) {
          LOCK();
          (_reader->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (_reader->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        for (lVar12 = 0; lVar2 * 8 != lVar12; lVar12 = lVar12 + 8) {
          plVar5 = *(long **)((long)ppDVar4 + lVar12);
          local_98.d = (Data *)*plVar5;
          local_98.ptr = (char16_t *)plVar5[1];
          local_98.size = plVar5[2];
          if (local_98.d != (Data *)0x0) {
            LOCK();
            ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          pFVar8 = _stdout;
          if (local_98.size != 0) {
            QString::toLocal8Bit((QByteArray *)&local_b0,(QString *)&local_98);
            pcVar10 = local_b0.ptr;
            if (local_b0.ptr == (char *)0x0) {
              pcVar10 = (char *)&QByteArray::_empty;
            }
            fprintf(pFVar8,"%s\n",pcVar10);
            QArrayDataPointer<char>::~QArrayDataPointer(&local_b0);
          }
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
        }
        QArrayDataPointer<DomInclude_*>::~QArrayDataPointer
                  ((QArrayDataPointer<DomInclude_*> *)&reader);
      }
      pDVar6 = this_00->m_customWidgets;
      if (pDVar6 != (DomCustomWidgets *)0x0) {
        _reader = (Data *)(pDVar6->m_customWidget).d.d;
        ppDVar7 = (pDVar6->m_customWidget).d.ptr;
        lVar2 = (pDVar6->m_customWidget).d.size;
        if (_reader != (Data *)0x0) {
          LOCK();
          (_reader->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (_reader->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        for (lVar12 = 0; lVar2 * 8 != lVar12; lVar12 = lVar12 + 8) {
          plVar5 = *(long **)(*(long *)((long)ppDVar7 + lVar12) + 0x38);
          if (plVar5 != (long *)0x0) {
            local_98.d = (Data *)*plVar5;
            local_98.ptr = (char16_t *)plVar5[1];
            local_98.size = plVar5[2];
            if (local_98.d != (Data *)0x0) {
              LOCK();
              ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            pFVar8 = _stdout;
            if (local_98.size != 0) {
              QString::toLocal8Bit((QByteArray *)&local_b0,(QString *)&local_98);
              pcVar10 = local_b0.ptr;
              if (local_b0.ptr == (char *)0x0) {
                pcVar10 = (char *)&QByteArray::_empty;
              }
              fprintf(pFVar8,"%s\n",pcVar10);
              QArrayDataPointer<char>::~QArrayDataPointer(&local_b0);
            }
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
          }
        }
        QArrayDataPointer<DomCustomWidget_*>::~QArrayDataPointer
                  ((QArrayDataPointer<DomCustomWidget_*> *)&reader);
      }
      DomUI::~DomUI(this_00);
      operator_delete(this_00,0x148);
      bVar11 = true;
      goto LAB_0016d3b3;
    }
  }
  else {
    QFile::setFileName(&local_68);
    cVar9 = QFile::open(&local_68,1);
    if (cVar9 != '\0') goto LAB_0016d142;
  }
  bVar11 = false;
LAB_0016d3b3:
  QFile::~QFile((QFile *)&local_68);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar11;
}

Assistant:

bool Uic::printDependencies()
{
    QString fileName = opt.inputFile;

    QFile f;
    if (fileName.isEmpty()) {
        if (!f.open(stdin, QIODevice::ReadOnly))
            return false;
    } else {
        f.setFileName(fileName);
        if (!f.open(QIODevice::ReadOnly))
            return false;
    }

    DomUI *ui = nullptr;
    {
        QXmlStreamReader reader;
        reader.setDevice(&f);
        ui = parseUiFile(reader);
        if (!ui)
            return false;
    }

    if (DomIncludes *includes = ui->elementIncludes()) {
        const auto incls = includes->elementInclude();
        for (DomInclude *incl : incls) {
            QString file = incl->text();
            if (file.isEmpty())
                continue;

            fprintf(stdout, "%s\n", file.toLocal8Bit().constData());
        }
    }

    if (DomCustomWidgets *customWidgets = ui->elementCustomWidgets()) {
        const auto elementCustomWidget = customWidgets->elementCustomWidget();
        for (DomCustomWidget *customWidget : elementCustomWidget) {
            if (DomHeader *header = customWidget->elementHeader()) {
                QString file = header->text();
                if (file.isEmpty())
                    continue;

                fprintf(stdout, "%s\n", file.toLocal8Bit().constData());
            }
        }
    }

    delete ui;

    return true;
}